

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::callSolveQp(Highs *this)

{
  HighsModel *this_00;
  HighsInt *pHVar1;
  uint d;
  double dVar2;
  pointer pdVar3;
  QpAsmStatus QVar4;
  HighsStatus HVar5;
  iterator __begin2;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Statistics stats;
  string local_460;
  _Any_data local_440;
  code *local_430;
  code *local_428;
  _Any_data local_420;
  code *local_410;
  code *local_408;
  _Any_data local_400;
  code *local_3f0;
  code *local_3e8;
  Settings local_3e0;
  Instance local_308;
  Statistics local_108;
  
  uVar6 = (this->model_).hessian_.dim_;
  d = (this->model_).lp_.num_col_;
  if ((int)d < (int)uVar6) {
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                "Hessian dimension = %d is incompatible with matrix dimension = %d\n",(ulong)uVar6,
                (ulong)d);
    this->model_status_ = kModelError;
    (this->solution_).value_valid = false;
    (this->solution_).dual_valid = false;
    HVar5 = kError;
  }
  else {
    local_308.num_con = (this->model_).lp_.num_row_;
    local_308.sense = 1;
    local_308.offset = 0.0;
    local_308.num_var = d;
    QpVector::QpVector(&local_308.c,d);
    local_308.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_308.Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_308.Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_308.Q._73_8_ = 0;
    local_308.A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_308.A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_308.A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_308.A._73_8_ = 0;
    local_308.con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.sense = (this->model_).lp_.sense_;
    local_308.num_con = (this->model_).lp_.num_row_;
    local_308.num_var = (this->model_).lp_.num_col_;
    local_308.Q.mat.num_row = d;
    local_308.Q.mat.num_col = d;
    local_308.A.mat.num_row = local_308.num_con;
    local_308.A.mat.num_col = local_308.num_var;
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_308.A.mat.start,&(this->model_).lp_.a_matrix_.start_);
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_308.A.mat.index,&(this->model_).lp_.a_matrix_.index_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.A.mat.value,&(this->model_).lp_.a_matrix_.value_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.c.value,&(this->model_).lp_.col_cost_);
    local_308.offset = (this->model_).lp_.offset_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.con_lo,&(this->model_).lp_.row_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.con_up,&(this->model_).lp_.row_upper_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.var_lo,&(this->model_).lp_.col_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_308.var_up,&(this->model_).lp_.col_upper_);
    this_00 = &this->model_;
    local_308.Q.mat.num_row = (this_00->lp_).num_col_;
    local_308.Q.mat.num_col = local_308.Q.mat.num_row;
    triangularToSquareHessian
              (&(this->model_).hessian_,&local_308.Q.mat.start,&local_308.Q.mat.index,
               &local_308.Q.mat.value);
    uVar6 = (uint)((ulong)((long)local_308.c.value.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_308.c.value.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        if ((local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] != 0.0) ||
           (NAN(local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]))) {
          lVar8 = (long)local_308.c.num_nz;
          local_308.c.num_nz = local_308.c.num_nz + 1;
          local_308.c.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] = (int)uVar7;
        }
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
    if ((this->model_).lp_.sense_ == kMaximize) {
      for (; pdVar3 = local_308.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
          local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish;
          local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        *local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start =
             -*local_308.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      }
      for (; pdVar3 != local_308.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
        *pdVar3 = -*pdVar3;
      }
    }
    local_3e0.ratiotest = TwoPass;
    local_3e0.ratiotest_t = 1e-09;
    local_3e0.ratiotest_d = 1e-08;
    local_3e0.pricing = Devex;
    local_3e0.pnorm_zero_threshold = 1e-11;
    local_3e0.improvement_zero_threshold = 0.0001;
    local_3e0.d_zero_threshold = 1e-12;
    local_3e0.lambda_zero_threshold = 1e-09;
    local_3e0.pQp_zero_threshold = 1e-07;
    local_3e0.hessianregularization = false;
    local_3e0.hessianregularizationfactor = 1e-07;
    local_3e0.phase1strategy = HIGHS;
    local_3e0.phase1movefreevarsbasic = false;
    local_3e0.phase1boundfreevars = false;
    local_3e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e0.reinvertfrequency = 1000;
    local_3e0.gradientrecomputefrequency = 100;
    local_3e0.reducedgradientrecomputefrequency = 0;
    local_3e0.reducedhessianrecomputefrequency = 0;
    local_3e0.time_limit = INFINITY;
    local_3e0.rowscaling = true;
    local_3e0.varscaling = true;
    local_3e0.perturbation = false;
    memset(&local_108,0,0xd8);
    local_3e0.reportingfequency = 100;
    local_3e0.iteration_limit = (this->options_).super_HighsOptionsStruct.qp_iteration_limit;
    local_3e0.nullspace_limit = (this->options_).super_HighsOptionsStruct.qp_nullspace_limit;
    local_400._8_8_ = 0;
    local_3e8 = std::
                _Function_handler<void_(QpModelStatus_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3814:7)>
                ::_M_invoke;
    local_3f0 = std::
                _Function_handler<void_(QpModelStatus_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3814:7)>
                ::_M_manager;
    local_400._M_unused._M_object = this;
    std::
    vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ::push_back(&local_3e0.qp_model_status_log.subscribers,(value_type *)&local_400);
    if (local_3f0 != (code *)0x0) {
      (*local_3f0)(&local_400,&local_400,__destroy_functor);
    }
    local_420._8_8_ = 0;
    local_408 = std::
                _Function_handler<void_(Statistics_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3825:36)>
                ::_M_invoke;
    local_410 = std::
                _Function_handler<void_(Statistics_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3825:36)>
                ::_M_manager;
    local_420._M_unused._M_object = this;
    std::
    vector<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ::push_back(&local_3e0.iteration_log.subscribers,(value_type *)&local_420);
    if (local_410 != (code *)0x0) {
      (*local_410)(&local_420,&local_420,__destroy_functor);
    }
    local_440._8_8_ = 0;
    local_428 = std::
                _Function_handler<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3837:42)>
                ::_M_invoke;
    local_430 = std::
                _Function_handler<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3837:42)>
                ::_M_manager;
    local_440._M_unused._M_object = this;
    std::vector<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>::
    push_back(&local_3e0.nullspace_limit_log.subscribers,(value_type *)&local_440);
    if (local_430 != (code *)0x0) {
      (*local_430)(&local_440,&local_440,__destroy_functor);
    }
    local_3e0.time_limit = (this->options_).super_HighsOptionsStruct.time_limit;
    local_3e0.lambda_zero_threshold =
         (this->options_).super_HighsOptionsStruct.dual_feasibility_tolerance;
    uVar7 = (ulong)(uint)(this->options_).super_HighsOptionsStruct.
                         simplex_primal_edge_weight_strategy;
    local_3e0.pricing = Devex;
    if (uVar7 < 3) {
      local_3e0.pricing = *(PricingStrategy *)(&DAT_003c7850 + uVar7 * 4);
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "  Iteration        Objective     NullspaceDim\n");
    QVar4 = solveqp(&local_308,&local_3e0,&local_108,&this->model_status_,&this->basis_,
                    &this->solution_,&this->timer_);
    HVar5 = kError;
    if (QVar4 != kError) {
      dVar2 = HighsModel::objectiveValue(this_00,&(this->solution_).col_value);
      (this->info_).super_HighsInfoStruct.objective_function_value = dVar2;
      getKktFailures(&this->options_,this_00,&this->solution_,&this->basis_,&this->info_);
      pHVar1 = &(this->info_).super_HighsInfoStruct.simplex_iteration_count;
      *pHVar1 = *pHVar1 + local_108.phase1_iterations;
      pHVar1 = &(this->info_).super_HighsInfoStruct.qp_iteration_count;
      *pHVar1 = *pHVar1 + local_108.num_iterations;
      (this->info_).super_HighsInfoStruct.valid = true;
      if (this->model_status_ == kOptimal) {
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"QP","");
        HVar5 = checkOptimality(this,&local_460);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
      }
      else {
        HVar5 = (HighsStatus)(QVar4 == kWarning);
      }
    }
    Statistics::~Statistics(&local_108);
    std::vector<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>::~vector
              (&local_3e0.nullspace_limit_log.subscribers);
    std::
    vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ::~vector(&local_3e0.qp_model_status_log.subscribers);
    std::
    vector<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ::~vector(&local_3e0.iteration_log.subscribers);
    Instance::~Instance(&local_308);
  }
  return HVar5;
}

Assistant:

HighsStatus Highs::callSolveQp() {
  // Check that the model is column-wise
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  assert(model_.lp_.a_matrix_.isColwise());
  if (hessian.dim_ > lp.num_col_) {
    highsLogDev(
        options_.log_options, HighsLogType::kError,
        "Hessian dimension = %d is incompatible with matrix dimension = %d\n",
        int(hessian.dim_), int(lp.num_col_));
    model_status_ = HighsModelStatus::kModelError;
    solution_.value_valid = false;
    solution_.dual_valid = false;
    return HighsStatus::kError;
  }
  //
  // Run the QP solver
  Instance instance(lp.num_col_, lp.num_row_);

  instance.sense = HighsInt(lp.sense_);
  instance.num_con = lp.num_row_;
  instance.num_var = lp.num_col_;

  instance.A.mat.num_col = lp.num_col_;
  instance.A.mat.num_row = lp.num_row_;
  instance.A.mat.start = lp.a_matrix_.start_;
  instance.A.mat.index = lp.a_matrix_.index_;
  instance.A.mat.value = lp.a_matrix_.value_;
  instance.c.value = lp.col_cost_;
  instance.offset = lp.offset_;
  instance.con_lo = lp.row_lower_;
  instance.con_up = lp.row_upper_;
  instance.var_lo = lp.col_lower_;
  instance.var_up = lp.col_upper_;
  instance.Q.mat.num_col = lp.num_col_;
  instance.Q.mat.num_row = lp.num_col_;
  triangularToSquareHessian(hessian, instance.Q.mat.start, instance.Q.mat.index,
                            instance.Q.mat.value);

  for (HighsInt i = 0; i < (HighsInt)instance.c.value.size(); i++) {
    if (instance.c.value[i] != 0.0) {
      instance.c.index[instance.c.num_nz++] = i;
    }
  }

  if (lp.sense_ == ObjSense::kMaximize) {
    // Negate the vector and Hessian
    for (double& i : instance.c.value) {
      i *= -1.0;
    }
    for (double& i : instance.Q.mat.value) {
      i *= -1.0;
    }
  }

  Settings settings;
  Statistics stats;

  settings.reportingfequency = 100;

  // Setting qp_update_limit = 10 leads to error with lpHighs3
  const HighsInt qp_update_limit = 1000;  // 1000; // default
  if (qp_update_limit != settings.reinvertfrequency) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Changing QP reinversion frequency from %d to %d\n",
                 int(settings.reinvertfrequency), int(qp_update_limit));
    settings.reinvertfrequency = qp_update_limit;
  }

  settings.iteration_limit = options_.qp_iteration_limit;
  settings.nullspace_limit = options_.qp_nullspace_limit;

  // Define the QP model status logging function
  settings.qp_model_status_log.subscribe(
      [this](QpModelStatus& qp_model_status) {
        if (qp_model_status == QpModelStatus::kUndetermined ||
            qp_model_status == QpModelStatus::kLargeNullspace ||
            qp_model_status == QpModelStatus::kError ||
            qp_model_status == QpModelStatus::kNotset)
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "QP solver model status: %s\n",
                       qpModelStatusToString(qp_model_status).c_str());
      });

  // Define the QP solver iteration logging function
  settings.iteration_log.subscribe([this](Statistics& stats) {
    int rep = stats.iteration.size() - 1;
    std::string time_string =
        options_.timeless_log ? ""
                              : highsFormatToString(" %9.2fs", stats.time[rep]);
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "%11d  %15.8g           %6d%s\n", int(stats.iteration[rep]),
                 stats.objval[rep], int(stats.nullspacedimension[rep]),
                 time_string.c_str());
  });

  // Define the QP nullspace limit logging function
  settings.nullspace_limit_log.subscribe([this](HighsInt& nullspace_limit) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "QP solver has exceeded nullspace limit of %d\n",
                 int(nullspace_limit));
  });

  settings.time_limit = options_.time_limit;
  settings.lambda_zero_threshold = options_.dual_feasibility_tolerance;

  switch (options_.simplex_primal_edge_weight_strategy) {
    case 0:
      settings.pricing = PricingStrategy::DantzigWolfe;
      break;
    case 1:
      settings.pricing = PricingStrategy::Devex;
      break;
    case 2:
      settings.pricing = PricingStrategy::SteepestEdge;
      break;
    default:
      settings.pricing = PricingStrategy::Devex;
  }

  // print header for QP solver output
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "  Iteration        Objective     NullspaceDim\n");

  QpAsmStatus status = solveqp(instance, settings, stats, model_status_, basis_,
                               solution_, timer_);
  // QP solver can fail, so should return something other than QpAsmStatus::kOk
  if (status == QpAsmStatus::kError) return HighsStatus::kError;

  assert(status == QpAsmStatus::kOk || status == QpAsmStatus::kWarning);
  HighsStatus return_status = status == QpAsmStatus::kWarning
                                  ? HighsStatus::kWarning
                                  : HighsStatus::kOk;

  // Get the objective and any KKT failures
  info_.objective_function_value = model_.objectiveValue(solution_.col_value);
  getKktFailures(options_, model_, solution_, basis_, info_);
  // Set the QP-specific values of info_
  info_.simplex_iteration_count += stats.phase1_iterations;
  info_.qp_iteration_count += stats.num_iterations;
  info_.valid = true;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("QP");
  return return_status;
}